

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

void embree::avx512::ConeCurveMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  ulong uVar73;
  byte bVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  byte bVar83;
  uint uVar84;
  uint uVar85;
  Scene *pSVar86;
  undefined1 auVar87 [8];
  uint uVar88;
  byte bVar89;
  byte bVar90;
  uint uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined4 uVar138;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar152 [36];
  undefined1 auVar153 [28];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar165;
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar168 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_5e0 [16];
  Primitive *local_5d0;
  Scene *local_5c8;
  RTCFilterFunctionNArguments local_5c0;
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  RTCHitN local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  undefined1 local_4a0 [32];
  uint local_480 [4];
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  uint local_420 [4];
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  uint local_400 [4];
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint local_3e0 [4];
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  int iVar96;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  undefined1 auVar151 [64];
  undefined1 auVar167 [32];
  
  pSVar86 = context->scene;
  pGVar9 = (pSVar86->geometries).items[line->sharedGeomID].ptr;
  uVar91 = (line->v0).field_0.i[0];
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar85 = (line->v0).field_0.i[1];
  uVar84 = (line->v0).field_0.i[2];
  uVar88 = (line->v0).field_0.i[3];
  uVar5 = (line->v0).field_0.i[4];
  auVar110._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  auVar110._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar91 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[5];
  auVar128._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar128._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar85 * (long)p_Var11);
  uVar7 = (line->v0).field_0.i[6];
  auVar106._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar106._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar84 * (long)p_Var11);
  uVar8 = (line->v0).field_0.i[7];
  auVar107._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar8 * (long)p_Var11);
  auVar107._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar88 * (long)p_Var11);
  auVar97 = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar121._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar10 + (ulong)(uVar91 + 1) * (long)p_Var11);
  auVar121._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  auVar97 = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar149._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar10 + (ulong)(uVar85 + 1) * (long)p_Var11);
  auVar149._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  auVar97 = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar154._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar10 + (ulong)(uVar84 + 1) * (long)p_Var11);
  auVar154._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  auVar97 = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar156._0_16_ =
       ZEXT116(0) * auVar97 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar10 + (ulong)(uVar88 + 1) * (long)p_Var11);
  auVar156._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
  local_e0 = vpbroadcastd_avx512vl();
  auVar103 = vunpcklps_avx(auVar110,auVar106);
  auVar101 = vunpckhps_avx(auVar110,auVar106);
  auVar110 = vunpcklps_avx(auVar128,auVar107);
  auVar102 = vunpckhps_avx(auVar128,auVar107);
  auVar106 = vunpcklps_avx(auVar103,auVar110);
  auVar110 = vunpckhps_avx(auVar103,auVar110);
  auVar107 = vunpcklps_avx(auVar101,auVar102);
  auVar128 = vunpckhps_avx(auVar101,auVar102);
  auVar103 = vpunpckldq_avx2(auVar121,auVar154);
  auVar101 = vpunpckhdq_avx2(auVar121,auVar154);
  auVar121 = vpunpckldq_avx2(auVar149,auVar156);
  auVar102 = vpunpckhdq_avx2(auVar149,auVar156);
  auVar154 = vpunpckldq_avx2(auVar103,auVar121);
  auVar121 = vpunpckhdq_avx2(auVar103,auVar121);
  auVar156 = vpunpckldq_avx2(auVar101,auVar102);
  auVar149 = vpunpckhdq_avx2(auVar101,auVar102);
  auVar101 = vpcmpeqd_avx2(auVar103,auVar103);
  uVar93 = vpcmpd_avx512vl(auVar101,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar105._4_4_ = fVar1;
  auVar105._0_4_ = fVar1;
  auVar105._8_4_ = fVar1;
  auVar105._12_4_ = fVar1;
  auVar105._16_4_ = fVar1;
  auVar105._20_4_ = fVar1;
  auVar105._24_4_ = fVar1;
  auVar105._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x10);
  auVar108._4_4_ = fVar2;
  auVar108._0_4_ = fVar2;
  auVar108._8_4_ = fVar2;
  auVar108._12_4_ = fVar2;
  auVar108._16_4_ = fVar2;
  auVar108._20_4_ = fVar2;
  auVar108._24_4_ = fVar2;
  auVar108._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x20);
  auVar109._4_4_ = fVar3;
  auVar109._0_4_ = fVar3;
  auVar109._8_4_ = fVar3;
  auVar109._12_4_ = fVar3;
  auVar109._16_4_ = fVar3;
  auVar109._20_4_ = fVar3;
  auVar109._24_4_ = fVar3;
  auVar109._28_4_ = fVar3;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar188 = ZEXT3264(auVar98);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar189 = ZEXT3264(auVar99);
  auVar100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar190 = ZEXT3264(auVar100);
  auVar97 = vmulss_avx512f(auVar100._0_16_,auVar100._0_16_);
  auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar99,auVar99);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
  auVar103._0_4_ = auVar101._0_4_;
  auVar103._4_4_ = auVar103._0_4_;
  auVar103._8_4_ = auVar103._0_4_;
  auVar103._12_4_ = auVar103._0_4_;
  auVar103._16_4_ = auVar103._0_4_;
  auVar103._20_4_ = auVar103._0_4_;
  auVar103._24_4_ = auVar103._0_4_;
  auVar103._28_4_ = auVar103._0_4_;
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar101);
  auVar97 = vfmadd132ps_fma(auVar101,auVar102,auVar102);
  auVar104._0_4_ = auVar106._0_4_ + auVar154._0_4_;
  auVar104._4_4_ = auVar106._4_4_ + auVar154._4_4_;
  auVar104._8_4_ = auVar106._8_4_ + auVar154._8_4_;
  auVar104._12_4_ = auVar106._12_4_ + auVar154._12_4_;
  auVar104._16_4_ = auVar106._16_4_ + auVar154._16_4_;
  auVar104._20_4_ = auVar106._20_4_ + auVar154._20_4_;
  auVar104._24_4_ = auVar106._24_4_ + auVar154._24_4_;
  auVar104._28_4_ = auVar106._28_4_ + auVar154._28_4_;
  auVar111._0_4_ = auVar121._0_4_ + auVar110._0_4_;
  auVar111._4_4_ = auVar121._4_4_ + auVar110._4_4_;
  auVar111._8_4_ = auVar121._8_4_ + auVar110._8_4_;
  auVar111._12_4_ = auVar121._12_4_ + auVar110._12_4_;
  auVar111._16_4_ = auVar121._16_4_ + auVar110._16_4_;
  auVar111._20_4_ = auVar121._20_4_ + auVar110._20_4_;
  auVar111._24_4_ = auVar121._24_4_ + auVar110._24_4_;
  auVar111._28_4_ = auVar121._28_4_ + auVar110._28_4_;
  auVar112._0_4_ = auVar107._0_4_ + auVar156._0_4_;
  auVar112._4_4_ = auVar107._4_4_ + auVar156._4_4_;
  auVar112._8_4_ = auVar107._8_4_ + auVar156._8_4_;
  auVar112._12_4_ = auVar107._12_4_ + auVar156._12_4_;
  auVar112._16_4_ = auVar107._16_4_ + auVar156._16_4_;
  auVar112._20_4_ = auVar107._20_4_ + auVar156._20_4_;
  auVar112._24_4_ = auVar107._24_4_ + auVar156._24_4_;
  auVar112._28_4_ = auVar107._28_4_ + auVar156._28_4_;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar102 = vmulps_avx512vl(auVar104,auVar101);
  auVar103 = vmulps_avx512vl(auVar111,auVar101);
  auVar104 = vmulps_avx512vl(auVar112,auVar101);
  auVar101 = vsubps_avx(auVar102,auVar105);
  auVar102 = vsubps_avx(auVar103,auVar108);
  auVar103 = vsubps_avx(auVar104,auVar109);
  auVar103 = vmulps_avx512vl(auVar103,auVar100);
  auVar102 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar102);
  auVar101 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar101);
  auVar139._0_4_ = auVar101._0_4_ * auVar97._0_4_;
  auVar139._4_4_ = auVar101._4_4_ * auVar97._4_4_;
  auVar139._8_4_ = auVar101._8_4_ * auVar97._8_4_;
  auVar139._12_4_ = auVar101._12_4_ * auVar97._12_4_;
  auVar139._16_4_ = auVar101._16_4_ * 0.0;
  auVar139._20_4_ = auVar101._20_4_ * 0.0;
  auVar139._24_4_ = auVar101._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar101 = vmulps_avx512vl(auVar98,auVar139);
  auVar102 = vmulps_avx512vl(auVar99,auVar139);
  auVar103 = vmulps_avx512vl(auVar100,auVar139);
  auVar115._0_4_ = auVar101._0_4_ + fVar1;
  auVar115._4_4_ = auVar101._4_4_ + fVar1;
  auVar115._8_4_ = auVar101._8_4_ + fVar1;
  auVar115._12_4_ = auVar101._12_4_ + fVar1;
  auVar115._16_4_ = auVar101._16_4_ + fVar1;
  auVar115._20_4_ = auVar101._20_4_ + fVar1;
  auVar115._24_4_ = auVar101._24_4_ + fVar1;
  auVar115._28_4_ = auVar101._28_4_ + fVar1;
  auVar116._0_4_ = auVar102._0_4_ + fVar2;
  auVar116._4_4_ = auVar102._4_4_ + fVar2;
  auVar116._8_4_ = auVar102._8_4_ + fVar2;
  auVar116._12_4_ = auVar102._12_4_ + fVar2;
  auVar116._16_4_ = auVar102._16_4_ + fVar2;
  auVar116._20_4_ = auVar102._20_4_ + fVar2;
  auVar116._24_4_ = auVar102._24_4_ + fVar2;
  auVar116._28_4_ = auVar102._28_4_ + fVar2;
  auVar117._0_4_ = fVar3 + auVar103._0_4_;
  auVar117._4_4_ = fVar3 + auVar103._4_4_;
  auVar117._8_4_ = fVar3 + auVar103._8_4_;
  auVar117._12_4_ = fVar3 + auVar103._12_4_;
  auVar117._16_4_ = fVar3 + auVar103._16_4_;
  auVar117._20_4_ = fVar3 + auVar103._20_4_;
  auVar117._24_4_ = fVar3 + auVar103._24_4_;
  auVar117._28_4_ = fVar3 + auVar103._28_4_;
  auVar103 = vsubps_avx512vl(auVar154,auVar106);
  auVar191 = ZEXT3264(auVar103);
  auVar104 = vsubps_avx512vl(auVar121,auVar110);
  auVar192 = ZEXT3264(auVar104);
  auVar105 = vsubps_avx512vl(auVar156,auVar107);
  auVar193 = ZEXT3264(auVar105);
  _local_580 = vsubps_avx512vl(auVar115,auVar106);
  _local_560 = vsubps_avx(auVar116,auVar110);
  auVar106 = vsubps_avx512vl(auVar117,auVar107);
  auVar195 = ZEXT3264(auVar106);
  auVar101 = vmulps_avx512vl(auVar105,auVar105);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar104);
  auVar107 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar103);
  auVar101 = vmulps_avx512vl(auVar105,auVar106);
  auVar101 = vfmadd231ps_avx512vl(auVar101,_local_560,auVar104);
  auVar108 = vfmadd231ps_avx512vl(auVar101,_local_580,auVar103);
  auVar101 = vmulps_avx512vl(auVar105,auVar100);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar104);
  auVar109 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar103);
  auVar101 = vsubps_avx(auVar128,auVar149);
  fVar1 = auVar101._0_4_;
  fVar3 = auVar101._4_4_;
  fVar54 = auVar101._8_4_;
  fVar57 = auVar101._12_4_;
  fVar60 = auVar101._16_4_;
  fVar63 = auVar101._20_4_;
  fVar66 = auVar101._24_4_;
  auVar143._0_4_ = fVar1 * fVar1 + auVar107._0_4_;
  auVar143._4_4_ = fVar3 * fVar3 + auVar107._4_4_;
  auVar143._8_4_ = fVar54 * fVar54 + auVar107._8_4_;
  auVar143._12_4_ = fVar57 * fVar57 + auVar107._12_4_;
  auVar143._16_4_ = fVar60 * fVar60 + auVar107._16_4_;
  auVar143._20_4_ = fVar63 * fVar63 + auVar107._20_4_;
  auVar143._24_4_ = fVar66 * fVar66 + auVar107._24_4_;
  auVar143._28_4_ = auVar110._28_4_ + auVar107._28_4_;
  auVar102 = vmulps_avx512vl(auVar100,auVar106);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,_local_560);
  auVar110 = vfmadd231ps_avx512vl(auVar102,auVar98,_local_580);
  auVar102 = vmulps_avx512vl(auVar106,auVar106);
  auVar102 = vfmadd231ps_avx512vl(auVar102,_local_560,_local_560);
  auVar111 = vfmadd231ps_avx512vl(auVar102,_local_580,_local_580);
  auVar112 = vmulps_avx512vl(auVar107,auVar107);
  auVar196 = ZEXT3264(auVar112);
  auVar113 = vmulps_avx512vl(auVar128,auVar107);
  fVar2 = auVar109._0_4_;
  fVar166 = fVar2 * fVar2;
  fVar52 = auVar109._4_4_;
  fVar169 = fVar52 * fVar52;
  auVar102._4_4_ = fVar169;
  auVar102._0_4_ = fVar166;
  fVar55 = auVar109._8_4_;
  fVar170 = fVar55 * fVar55;
  auVar102._8_4_ = fVar170;
  fVar58 = auVar109._12_4_;
  fVar171 = fVar58 * fVar58;
  auVar102._12_4_ = fVar171;
  fVar61 = auVar109._16_4_;
  fVar172 = fVar61 * fVar61;
  auVar102._16_4_ = fVar172;
  fVar64 = auVar109._20_4_;
  fVar173 = fVar64 * fVar64;
  auVar102._20_4_ = fVar173;
  fVar67 = auVar109._24_4_;
  fVar174 = fVar67 * fVar67;
  auVar102._24_4_ = fVar174;
  auVar102._28_4_ = local_560._28_4_;
  auVar102 = vmulps_avx512vl(auVar143,auVar102);
  auVar102 = vsubps_avx512vl(auVar112,auVar102);
  auVar110 = vmulps_avx512vl(auVar112,auVar110);
  auVar114 = vmulps_avx512vl(auVar109,auVar108);
  auVar114 = vmulps_avx512vl(auVar143,auVar114);
  auVar110 = vsubps_avx512vl(auVar110,auVar114);
  auVar114 = vmulps_avx512vl(auVar101,auVar109);
  auVar114 = vmulps_avx512vl(auVar113,auVar114);
  auVar110 = vaddps_avx512vl(auVar114,auVar110);
  auVar111 = vmulps_avx512vl(auVar112,auVar111);
  auVar114 = vmulps_avx512vl(auVar108,auVar108);
  auVar114 = vmulps_avx512vl(auVar143,auVar114);
  auVar111 = vsubps_avx512vl(auVar111,auVar114);
  auVar101 = vaddps_avx512vl(auVar101,auVar101);
  auVar101 = vmulps_avx512vl(auVar101,auVar108);
  auVar101 = vsubps_avx512vl(auVar101,auVar113);
  auVar101 = vmulps_avx512vl(auVar113,auVar101);
  auVar101 = vaddps_avx512vl(auVar111,auVar101);
  auVar111 = vmulps_avx512vl(auVar110,auVar110);
  auVar101 = vmulps_avx512vl(auVar102,auVar101);
  auVar101 = vsubps_avx512vl(auVar111,auVar101);
  auVar111 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar95 = vcmpps_avx512vl(auVar101,auVar111,5);
  bVar83 = (byte)(uVar93 & uVar95);
  if (bVar83 == 0) {
    return;
  }
  auVar154 = vsubps_avx(auVar115,auVar154);
  auVar121 = vsubps_avx(auVar116,auVar121);
  auVar156 = vsubps_avx(auVar117,auVar156);
  auVar115 = vsqrtps_avx512vl(auVar101);
  auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar101 = vrcp14ps_avx512vl(auVar102);
  auVar117 = vfnmadd213ps_avx512vl(auVar101,auVar102,auVar116);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar102,auVar113);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar117,auVar114,2);
  auVar102 = vfmadd132ps_avx512vl(auVar117,auVar101,auVar101);
  auVar150._8_4_ = 0x80000000;
  auVar150._0_8_ = 0x8000000080000000;
  auVar150._12_4_ = 0x80000000;
  auVar150._16_4_ = 0x80000000;
  auVar150._20_4_ = 0x80000000;
  auVar150._24_4_ = 0x80000000;
  auVar150._28_4_ = 0x80000000;
  auVar151 = ZEXT3264(auVar150);
  auVar101 = vxorps_avx512vl(auVar110,auVar150);
  auVar101 = vsubps_avx(auVar101,auVar115);
  auVar101 = vmulps_avx512vl(auVar101,auVar102);
  auVar177._8_4_ = 0xff800000;
  auVar177._0_8_ = 0xff800000ff800000;
  auVar177._12_4_ = 0xff800000;
  auVar177._16_4_ = 0xff800000;
  auVar177._20_4_ = 0xff800000;
  auVar177._24_4_ = 0xff800000;
  auVar177._28_4_ = 0xff800000;
  bVar12 = (bool)((byte)uVar92 & 1);
  auVar118._0_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._0_4_;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._4_4_;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._8_4_;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._12_4_;
  bVar12 = (bool)((byte)(uVar92 >> 4) & 1);
  auVar118._16_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._16_4_;
  bVar12 = (bool)((byte)(uVar92 >> 5) & 1);
  auVar118._20_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._20_4_;
  bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
  auVar118._24_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._24_4_;
  bVar12 = SUB81(uVar92 >> 7,0);
  auVar118._28_4_ = (uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar101._28_4_;
  auVar101 = vsubps_avx512vl(auVar115,auVar110);
  auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar187 = ZEXT3264(auVar113);
  auVar101 = vmulps_avx512vl(auVar101,auVar102);
  bVar12 = (bool)((byte)uVar92 & 1);
  iVar96 = auVar113._0_4_;
  auVar119._0_4_ = (uint)bVar12 * iVar96 | (uint)!bVar12 * auVar101._0_4_;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  iVar131 = auVar113._4_4_;
  auVar119._4_4_ = (uint)bVar12 * iVar131 | (uint)!bVar12 * auVar101._4_4_;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  iVar132 = auVar113._8_4_;
  auVar119._8_4_ = (uint)bVar12 * iVar132 | (uint)!bVar12 * auVar101._8_4_;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  iVar133 = auVar113._12_4_;
  auVar119._12_4_ = (uint)bVar12 * iVar133 | (uint)!bVar12 * auVar101._12_4_;
  bVar12 = (bool)((byte)(uVar92 >> 4) & 1);
  iVar134 = auVar113._16_4_;
  auVar119._16_4_ = (uint)bVar12 * iVar134 | (uint)!bVar12 * auVar101._16_4_;
  bVar12 = (bool)((byte)(uVar92 >> 5) & 1);
  iVar135 = auVar113._20_4_;
  auVar119._20_4_ = (uint)bVar12 * iVar135 | (uint)!bVar12 * auVar101._20_4_;
  bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
  iVar136 = auVar113._24_4_;
  iVar137 = auVar113._28_4_;
  auVar119._24_4_ = (uint)bVar12 * iVar136 | (uint)!bVar12 * auVar101._24_4_;
  bVar12 = SUB81(uVar92 >> 7,0);
  auVar119._28_4_ = (uint)bVar12 * iVar137 | (uint)!bVar12 * auVar101._28_4_;
  auVar101 = vmulps_avx512vl(auVar109,auVar118);
  auVar175._0_4_ = auVar108._0_4_ + auVar101._0_4_;
  auVar175._4_4_ = auVar108._4_4_ + auVar101._4_4_;
  auVar175._8_4_ = auVar108._8_4_ + auVar101._8_4_;
  auVar175._12_4_ = auVar108._12_4_ + auVar101._12_4_;
  auVar175._16_4_ = auVar108._16_4_ + auVar101._16_4_;
  auVar175._20_4_ = auVar108._20_4_ + auVar101._20_4_;
  auVar175._24_4_ = auVar108._24_4_ + auVar101._24_4_;
  fVar165 = auVar108._28_4_;
  auVar175._28_4_ = fVar165 + auVar101._28_4_;
  auVar101 = vmulps_avx512vl(auVar109,auVar119);
  auVar114 = vaddps_avx512vl(auVar108,auVar101);
  uVar69 = vcmpps_avx512vl(auVar175,auVar107,1);
  uVar70 = vcmpps_avx512vl(auVar175,auVar111,6);
  uVar71 = vcmpps_avx512vl(auVar114,auVar107,1);
  uVar72 = vcmpps_avx512vl(auVar114,auVar111,6);
  auVar168._0_4_ = fVar2 * (float)local_580._0_4_;
  auVar168._4_4_ = fVar52 * (float)local_580._4_4_;
  auVar168._8_4_ = fVar55 * fStack_578;
  auVar168._12_4_ = fVar58 * fStack_574;
  auVar168._16_4_ = fVar61 * fStack_570;
  auVar168._20_4_ = fVar64 * fStack_56c;
  auVar168._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
  auVar168._24_4_ = fVar67 * fStack_568;
  auVar101 = vmulps_avx512vl(auVar109,_local_560);
  auVar102 = vmulps_avx512vl(auVar109,auVar106);
  auVar110 = vmulps_avx512vl(auVar98,auVar108);
  auVar110 = vsubps_avx512vl(auVar168._0_32_,auVar110);
  auVar111 = vmulps_avx512vl(auVar99,auVar108);
  auVar101 = vsubps_avx512vl(auVar101,auVar111);
  auVar111 = vmulps_avx512vl(auVar100,auVar108);
  auVar102 = vsubps_avx512vl(auVar102,auVar111);
  auVar102 = vmulps_avx512vl(auVar102,auVar102);
  auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,auVar110);
  fVar51 = auVar128._0_4_;
  fVar53 = auVar128._4_4_;
  fVar56 = auVar128._8_4_;
  fVar59 = auVar128._12_4_;
  fVar62 = auVar128._16_4_;
  fVar65 = auVar128._20_4_;
  fVar68 = auVar128._24_4_;
  auVar75._4_4_ = fVar53 * fVar53 * fVar169;
  auVar75._0_4_ = fVar51 * fVar51 * fVar166;
  auVar75._8_4_ = fVar56 * fVar56 * fVar170;
  auVar75._12_4_ = fVar59 * fVar59 * fVar171;
  auVar75._16_4_ = fVar62 * fVar62 * fVar172;
  auVar75._20_4_ = fVar65 * fVar65 * fVar173;
  auVar75._24_4_ = fVar68 * fVar68 * fVar174;
  auVar75._28_4_ = auVar110._28_4_;
  uVar92 = vcmpps_avx512vl(auVar101,auVar75,1);
  uVar92 = (bVar83 & ~(byte)line->leftExists) & uVar92;
  auVar101 = vrcp14ps_avx512vl(auVar109);
  auVar102 = vfnmadd213ps_avx512vl(auVar101,auVar109,auVar116);
  auVar111 = vfmadd132ps_avx512vl(auVar102,auVar101,auVar101);
  auVar159._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
  auVar159._8_4_ = -auVar108._8_4_;
  auVar159._12_4_ = -auVar108._12_4_;
  auVar159._16_4_ = -auVar108._16_4_;
  auVar159._20_4_ = -auVar108._20_4_;
  auVar159._24_4_ = -auVar108._24_4_;
  auVar159._28_4_ = -fVar165;
  auVar101 = vmulps_avx512vl(auVar111,auVar159);
  bVar12 = (bool)((byte)uVar92 & 1);
  auVar120._0_4_ = (uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * iVar96;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar120._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * iVar131;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar120._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * iVar132;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar120._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * iVar133;
  bVar12 = (bool)((byte)(uVar92 >> 4) & 1);
  auVar120._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * iVar134;
  bVar12 = (bool)((byte)(uVar92 >> 5) & 1);
  auVar120._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * iVar135;
  bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
  auVar120._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * iVar136;
  bVar12 = SUB81(uVar92 >> 7,0);
  auVar120._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * iVar137;
  auVar186 = ZEXT3264(auVar120);
  auVar101 = vmulps_avx512vl(auVar105,auVar156);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar121,auVar104);
  auVar108 = vfmadd231ps_avx512vl(auVar101,auVar154,auVar103);
  auVar76._4_4_ = auVar154._4_4_ * fVar52;
  auVar76._0_4_ = auVar154._0_4_ * fVar2;
  auVar76._8_4_ = auVar154._8_4_ * fVar55;
  auVar76._12_4_ = auVar154._12_4_ * fVar58;
  auVar76._16_4_ = auVar154._16_4_ * fVar61;
  auVar76._20_4_ = auVar154._20_4_ * fVar64;
  auVar76._24_4_ = auVar154._24_4_ * fVar67;
  auVar76._28_4_ = fVar165;
  auVar77._4_4_ = auVar121._4_4_ * fVar52;
  auVar77._0_4_ = auVar121._0_4_ * fVar2;
  auVar77._8_4_ = auVar121._8_4_ * fVar55;
  auVar77._12_4_ = auVar121._12_4_ * fVar58;
  auVar77._16_4_ = auVar121._16_4_ * fVar61;
  auVar77._20_4_ = auVar121._20_4_ * fVar64;
  auVar77._24_4_ = auVar121._24_4_ * fVar67;
  auVar77._28_4_ = auVar154._28_4_;
  auVar78._4_4_ = auVar156._4_4_ * fVar52;
  auVar78._0_4_ = auVar156._0_4_ * fVar2;
  auVar78._8_4_ = auVar156._8_4_ * fVar55;
  auVar78._12_4_ = auVar156._12_4_ * fVar58;
  auVar78._16_4_ = auVar156._16_4_ * fVar61;
  auVar78._20_4_ = auVar156._20_4_ * fVar64;
  auVar78._24_4_ = auVar156._24_4_ * fVar67;
  auVar78._28_4_ = auVar109._28_4_;
  auVar101 = vmulps_avx512vl(auVar98,auVar108);
  auVar101 = vsubps_avx(auVar76,auVar101);
  auVar102 = vmulps_avx512vl(auVar99,auVar108);
  auVar102 = vsubps_avx(auVar77,auVar102);
  auVar121 = vmulps_avx512vl(auVar100,auVar108);
  auVar110 = vsubps_avx(auVar78,auVar121);
  auVar79._4_4_ = auVar110._4_4_ * auVar110._4_4_;
  auVar79._0_4_ = auVar110._0_4_ * auVar110._0_4_;
  auVar79._8_4_ = auVar110._8_4_ * auVar110._8_4_;
  auVar79._12_4_ = auVar110._12_4_ * auVar110._12_4_;
  auVar79._16_4_ = auVar110._16_4_ * auVar110._16_4_;
  auVar79._20_4_ = auVar110._20_4_ * auVar110._20_4_;
  auVar79._24_4_ = auVar110._24_4_ * auVar110._24_4_;
  auVar79._28_4_ = auVar110._28_4_;
  auVar97 = vfmadd231ps_fma(auVar79,auVar102,auVar102);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar101,auVar101);
  auVar80._4_4_ = fVar169 * auVar149._4_4_ * auVar149._4_4_;
  auVar80._0_4_ = fVar166 * auVar149._0_4_ * auVar149._0_4_;
  auVar80._8_4_ = fVar170 * auVar149._8_4_ * auVar149._8_4_;
  auVar80._12_4_ = fVar171 * auVar149._12_4_ * auVar149._12_4_;
  auVar80._16_4_ = fVar172 * auVar149._16_4_ * auVar149._16_4_;
  auVar80._20_4_ = fVar173 * auVar149._20_4_ * auVar149._20_4_;
  auVar80._24_4_ = fVar174 * auVar149._24_4_ * auVar149._24_4_;
  auVar80._28_4_ = auVar149._28_4_;
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar163._4_4_ = uVar138;
  auVar163._0_4_ = uVar138;
  auVar163._8_4_ = uVar138;
  auVar163._12_4_ = uVar138;
  auVar163._16_4_ = uVar138;
  auVar163._20_4_ = uVar138;
  auVar163._24_4_ = uVar138;
  auVar163._28_4_ = uVar138;
  bVar90 = (byte)uVar69 & (byte)uVar70 & bVar83;
  auVar101 = vblendmps_avx512vl(auVar113,auVar118);
  auVar122._0_4_ = (uint)(bVar90 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar102._0_4_;
  bVar12 = (bool)(bVar90 >> 1 & 1);
  auVar122._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar102._4_4_;
  bVar12 = (bool)(bVar90 >> 2 & 1);
  auVar122._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar102._8_4_;
  bVar12 = (bool)(bVar90 >> 3 & 1);
  auVar122._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar102._12_4_;
  bVar12 = (bool)(bVar90 >> 4 & 1);
  auVar122._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar102._16_4_;
  bVar12 = (bool)(bVar90 >> 5 & 1);
  auVar122._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar102._20_4_;
  bVar12 = (bool)(bVar90 >> 6 & 1);
  auVar122._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar102._24_4_;
  auVar122._28_4_ =
       (uint)(bVar90 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar102._28_4_;
  auVar179 = ZEXT3264(auVar122);
  bVar90 = (byte)uVar71 & (byte)uVar72 & bVar83;
  auVar101 = vblendmps_avx512vl(auVar177,auVar119);
  auVar123._0_4_ = (uint)(bVar90 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar121._0_4_;
  bVar12 = (bool)(bVar90 >> 1 & 1);
  auVar123._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar121._4_4_;
  bVar12 = (bool)(bVar90 >> 2 & 1);
  auVar123._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar121._8_4_;
  bVar12 = (bool)(bVar90 >> 3 & 1);
  auVar123._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar121._12_4_;
  bVar12 = (bool)(bVar90 >> 4 & 1);
  auVar123._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar121._16_4_;
  bVar12 = (bool)(bVar90 >> 5 & 1);
  auVar123._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar121._20_4_;
  bVar12 = (bool)(bVar90 >> 6 & 1);
  auVar123._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar121._24_4_;
  auVar123._28_4_ =
       (uint)(bVar90 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar121._28_4_;
  auVar180 = ZEXT3264(auVar123);
  auVar160._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
  auVar160._8_4_ = auVar108._8_4_ ^ 0x80000000;
  auVar160._12_4_ = auVar108._12_4_ ^ 0x80000000;
  auVar160._16_4_ = auVar108._16_4_ ^ 0x80000000;
  auVar160._20_4_ = auVar108._20_4_ ^ 0x80000000;
  auVar160._24_4_ = auVar108._24_4_ ^ 0x80000000;
  auVar160._28_4_ = auVar108._28_4_ ^ 0x80000000;
  uVar92 = vcmpps_avx512vl(ZEXT1632(auVar97),auVar80,1);
  uVar92 = (bVar83 & ~(byte)line->rightExists) & uVar92;
  auVar101 = vmulps_avx512vl(auVar111,auVar160);
  bVar12 = (bool)((byte)uVar92 & 1);
  auVar124._0_4_ = (uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * iVar96;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar124._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * iVar131;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar124._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * iVar132;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar124._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * iVar133;
  bVar12 = (bool)((byte)(uVar92 >> 4) & 1);
  auVar124._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * iVar134;
  bVar12 = (bool)((byte)(uVar92 >> 5) & 1);
  auVar124._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * iVar135;
  bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
  auVar124._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * iVar136;
  bVar12 = SUB81(uVar92 >> 7,0);
  auVar124._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * iVar137;
  auVar101 = vminps_avx512vl(auVar120,auVar124);
  auVar110 = vmaxps_avx512vl(auVar120,auVar124);
  auVar102 = vminps_avx(auVar122,auVar101);
  uVar92 = vcmpps_avx512vl(auVar102,auVar101,0);
  uVar73 = vcmpps_avx512vl(auVar110,auVar113,0);
  bVar12 = (bool)((byte)uVar73 & 1);
  bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
  bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
  bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
  bVar21 = (bool)((byte)(uVar73 >> 4) & 1);
  bVar28 = (bool)((byte)(uVar73 >> 5) & 1);
  bVar36 = (bool)((byte)(uVar73 >> 6) & 1);
  bVar45 = SUB81(uVar73 >> 7,0);
  uVar73 = vcmpps_avx512vl(auVar101,auVar113,0);
  bVar13 = (bool)((byte)uVar73 & 1);
  bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
  bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
  bVar20 = (bool)((byte)(uVar73 >> 3) & 1);
  bVar22 = (bool)((byte)(uVar73 >> 4) & 1);
  bVar29 = (bool)((byte)(uVar73 >> 5) & 1);
  bVar37 = (bool)((byte)(uVar73 >> 6) & 1);
  bVar46 = SUB81(uVar73 >> 7,0);
  bVar14 = (bool)((byte)uVar92 & 1);
  auVar125._0_4_ =
       (uint)bVar14 * ((uint)bVar12 * -0x800000 | (uint)!bVar12 * auVar110._0_4_) |
       (uint)!bVar14 * ((uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar101._0_4_);
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar125._4_4_ =
       (uint)bVar12 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar110._4_4_) |
       (uint)!bVar12 * ((uint)bVar16 * -0x800000 | (uint)!bVar16 * auVar101._4_4_);
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar125._8_4_ =
       (uint)bVar12 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar110._8_4_) |
       (uint)!bVar12 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar101._8_4_);
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar125._12_4_ =
       (uint)bVar12 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar110._12_4_) |
       (uint)!bVar12 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar101._12_4_);
  bVar12 = (bool)((byte)(uVar92 >> 4) & 1);
  auVar125._16_4_ =
       (uint)bVar12 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar110._16_4_) |
       (uint)!bVar12 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar101._16_4_);
  bVar12 = (bool)((byte)(uVar92 >> 5) & 1);
  auVar125._20_4_ =
       (uint)bVar12 * ((uint)bVar28 * -0x800000 | (uint)!bVar28 * auVar110._20_4_) |
       (uint)!bVar12 * ((uint)bVar29 * -0x800000 | (uint)!bVar29 * auVar101._20_4_);
  bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
  auVar125._24_4_ =
       (uint)bVar12 * ((uint)bVar36 * -0x800000 | (uint)!bVar36 * auVar110._24_4_) |
       (uint)!bVar12 * ((uint)bVar37 * -0x800000 | (uint)!bVar37 * auVar101._24_4_);
  bVar12 = SUB81(uVar92 >> 7,0);
  auVar125._28_4_ =
       (uint)bVar12 * ((uint)bVar45 * -0x800000 | (uint)!bVar45 * auVar110._28_4_) |
       (uint)!bVar12 * ((uint)bVar46 * -0x800000 | (uint)!bVar46 * auVar101._28_4_);
  auVar101 = vmaxps_avx(auVar123,auVar125);
  auVar181 = ZEXT3264(auVar101);
  auVar157._0_4_ = auVar139._0_4_ + auVar102._0_4_;
  auVar157._4_4_ = auVar139._4_4_ + auVar102._4_4_;
  auVar157._8_4_ = auVar139._8_4_ + auVar102._8_4_;
  auVar157._12_4_ = auVar139._12_4_ + auVar102._12_4_;
  auVar157._16_4_ = auVar139._16_4_ + auVar102._16_4_;
  auVar157._20_4_ = auVar139._20_4_ + auVar102._20_4_;
  auVar157._24_4_ = auVar139._24_4_ + auVar102._24_4_;
  auVar157._28_4_ = auVar102._28_4_ + 0.0;
  uVar92 = vcmpps_avx512vl(auVar163,auVar157,2);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar161._4_4_ = uVar138;
  auVar161._0_4_ = uVar138;
  auVar161._8_4_ = uVar138;
  auVar161._12_4_ = uVar138;
  auVar161._16_4_ = uVar138;
  auVar161._20_4_ = uVar138;
  auVar161._24_4_ = uVar138;
  auVar161._28_4_ = uVar138;
  uVar73 = vcmpps_avx512vl(auVar157,auVar161,2);
  auVar167._0_4_ = auVar101._0_4_ + auVar139._0_4_;
  auVar167._4_4_ = auVar101._4_4_ + auVar139._4_4_;
  auVar167._8_4_ = auVar101._8_4_ + auVar139._8_4_;
  auVar167._12_4_ = auVar101._12_4_ + auVar139._12_4_;
  auVar167._16_4_ = auVar101._16_4_ + auVar139._16_4_;
  auVar167._20_4_ = auVar101._20_4_ + auVar139._20_4_;
  auVar167._24_4_ = auVar101._24_4_ + auVar139._24_4_;
  auVar167._28_4_ = auVar101._28_4_ + 0.0;
  auVar168 = ZEXT3264(auVar167);
  uVar69 = vcmpps_avx512vl(auVar163,auVar167,2);
  uVar70 = vcmpps_avx512vl(auVar167,auVar161,2);
  uVar71 = vcmpps_avx512vl(auVar101,auVar177,4);
  bVar89 = (byte)uVar69 & (byte)uVar70 & (byte)uVar71;
  uVar94 = vcmpps_avx512vl(auVar102,auVar113,4);
  uVar94 = uVar92 & uVar73 & uVar94;
  bVar90 = (byte)uVar94 & bVar83;
  bVar82 = bVar83 & ((byte)uVar94 | bVar89);
  uVar91 = (uint)bVar82;
  if (bVar82 == 0) {
    return;
  }
  auVar101 = vblendmps_avx512vl(auVar101,auVar102);
  auVar126._0_4_ =
       (float)((uint)(bVar90 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar90 & 1) * (int)auVar157._0_4_
              );
  bVar12 = (bool)(bVar90 >> 1 & 1);
  auVar126._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * (int)auVar157._4_4_);
  bVar12 = (bool)(bVar90 >> 2 & 1);
  auVar126._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * (int)auVar157._8_4_);
  bVar12 = (bool)(bVar90 >> 3 & 1);
  auVar126._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * (int)auVar157._12_4_);
  bVar12 = (bool)(bVar90 >> 4 & 1);
  auVar126._16_4_ = (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * (int)auVar157._16_4_);
  bVar12 = (bool)(bVar90 >> 5 & 1);
  auVar126._20_4_ = (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * (int)auVar157._20_4_);
  bVar12 = (bool)(bVar90 >> 6 & 1);
  auVar126._24_4_ = (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * (int)auVar157._24_4_);
  auVar126._28_4_ =
       (float)((uint)(bVar90 >> 7) * auVar101._28_4_ |
              (uint)!(bool)(bVar90 >> 7) * (int)auVar157._28_4_);
  auVar101 = vblendmps_avx512vl(auVar114,auVar175);
  auVar127._0_4_ =
       (float)((uint)(bVar90 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar90 & 1) * (int)auVar102._0_4_
              );
  bVar12 = (bool)(bVar90 >> 1 & 1);
  auVar127._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * (int)auVar102._4_4_);
  bVar12 = (bool)(bVar90 >> 2 & 1);
  auVar127._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * (int)auVar102._8_4_);
  bVar12 = (bool)(bVar90 >> 3 & 1);
  auVar127._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * (int)auVar102._12_4_);
  bVar12 = (bool)(bVar90 >> 4 & 1);
  auVar127._16_4_ = (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * (int)auVar102._16_4_);
  bVar12 = (bool)(bVar90 >> 5 & 1);
  auVar127._20_4_ = (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * (int)auVar102._20_4_);
  bVar12 = (bool)(bVar90 >> 6 & 1);
  auVar127._24_4_ = (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * (int)auVar102._24_4_);
  auVar127._28_4_ =
       (uint)(bVar90 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar90 >> 7) * (int)auVar102._28_4_;
  auVar101 = vrcp14ps_avx512vl(auVar107);
  auVar102 = vfnmadd213ps_avx512vl(auVar101,auVar107,auVar116);
  auVar97 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
  auVar176 = ZEXT1664(auVar97);
  auVar81._4_4_ = fVar53 * fVar3 * auVar107._4_4_;
  auVar81._0_4_ = fVar51 * fVar1 * auVar107._0_4_;
  auVar81._8_4_ = fVar56 * fVar54 * auVar107._8_4_;
  auVar81._12_4_ = fVar59 * fVar57 * auVar107._12_4_;
  auVar81._16_4_ = fVar62 * fVar60 * auVar107._16_4_;
  auVar81._20_4_ = fVar65 * fVar63 * auVar107._20_4_;
  auVar81._24_4_ = fVar68 * fVar66 * auVar107._24_4_;
  auVar81._28_4_ = auVar128._28_4_;
  _local_80 = vmulps_avx512vl(auVar103,auVar81);
  auVar102 = vmulps_avx512vl(auVar104,auVar81);
  auVar182 = ZEXT3264(auVar102);
  auVar110 = vmulps_avx512vl(auVar103,auVar143);
  auVar183 = ZEXT3264(auVar110);
  auVar128 = vmulps_avx512vl(auVar104,auVar143);
  auVar184 = ZEXT3264(auVar128);
  uVar69 = vcmpps_avx512vl(auVar126,auVar122,0);
  uVar70 = vcmpps_avx512vl(auVar126,auVar123,0);
  bVar74 = ((byte)uVar69 | (byte)uVar70) & bVar83;
  uVar92 = vcmpps_avx512vl(auVar126,auVar120,0);
  uVar92 = uVar93 & uVar95 & uVar92;
  auVar107 = vmulps_avx512vl(auVar98,auVar126);
  auVar145._0_4_ = auVar107._0_4_ + (float)local_580._0_4_;
  auVar145._4_4_ = auVar107._4_4_ + (float)local_580._4_4_;
  auVar145._8_4_ = auVar107._8_4_ + fStack_578;
  auVar145._12_4_ = auVar107._12_4_ + fStack_574;
  auVar145._16_4_ = auVar107._16_4_ + fStack_570;
  auVar145._20_4_ = auVar107._20_4_ + fStack_56c;
  auVar145._24_4_ = auVar107._24_4_ + fStack_568;
  auVar145._28_4_ = auVar107._28_4_ + fStack_564;
  auVar107 = vmulps_avx512vl(auVar112,auVar145);
  auVar146._0_4_ = local_80._0_4_ + auVar107._0_4_;
  auVar146._4_4_ = local_80._4_4_ + auVar107._4_4_;
  auVar146._8_4_ = local_80._8_4_ + auVar107._8_4_;
  auVar146._12_4_ = local_80._12_4_ + auVar107._12_4_;
  auVar146._16_4_ = local_80._16_4_ + auVar107._16_4_;
  auVar146._20_4_ = local_80._20_4_ + auVar107._20_4_;
  auVar146._24_4_ = local_80._24_4_ + auVar107._24_4_;
  auVar146._28_4_ = local_80._28_4_ + auVar107._28_4_;
  auVar110 = vmulps_avx512vl(auVar110,auVar127);
  auVar107 = vxorps_avx512vl(auVar103,auVar150);
  auVar194 = ZEXT3264(auVar107);
  auVar103 = vblendmps_avx512vl(auVar103,auVar107);
  bVar90 = (byte)uVar92;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
  bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
  bVar21 = (bool)((byte)(uVar92 >> 4) & 1);
  bVar29 = (bool)((byte)(uVar92 >> 5) & 1);
  bVar45 = (bool)((byte)(uVar92 >> 6) & 1);
  bVar47 = SUB81(uVar92 >> 7,0);
  auVar110 = vsubps_avx512vl(auVar146,auVar110);
  bVar13 = (bool)(bVar74 >> 1 & 1);
  bVar16 = (bool)(bVar74 >> 2 & 1);
  bVar19 = (bool)(bVar74 >> 3 & 1);
  bVar22 = (bool)(bVar74 >> 4 & 1);
  bVar36 = (bool)(bVar74 >> 5 & 1);
  bVar46 = (bool)(bVar74 >> 6 & 1);
  auVar107 = vmulps_avx512vl(auVar99,auVar126);
  auVar147._0_4_ = auVar107._0_4_ + (float)local_560._0_4_;
  auVar147._4_4_ = auVar107._4_4_ + (float)local_560._4_4_;
  auVar147._8_4_ = auVar107._8_4_ + fStack_558;
  auVar147._12_4_ = auVar107._12_4_ + fStack_554;
  auVar147._16_4_ = auVar107._16_4_ + fStack_550;
  auVar147._20_4_ = auVar107._20_4_ + fStack_54c;
  auVar147._24_4_ = auVar107._24_4_ + fStack_548;
  auVar147._28_4_ = auVar107._28_4_ + local_560._28_4_;
  auVar107 = vmulps_avx512vl(auVar112,auVar147);
  auVar102 = vaddps_avx512vl(auVar102,auVar107);
  iVar131 = (uint)!(bool)(bVar90 & 1) * auVar116._0_4_;
  iVar96 = (uint)!(bool)((byte)(uVar92 >> 1) & 1) * auVar116._4_4_;
  iVar132 = (uint)!(bool)((byte)(uVar92 >> 2) & 1) * auVar116._8_4_;
  iVar133 = (uint)!(bool)((byte)(uVar92 >> 3) & 1) * auVar116._12_4_;
  iVar134 = (uint)!(bool)((byte)(uVar92 >> 4) & 1) * auVar116._16_4_;
  iVar135 = (uint)!(bool)((byte)(uVar92 >> 5) & 1) * auVar116._20_4_;
  iVar136 = (uint)!(bool)((byte)(uVar92 >> 6) & 1) * auVar116._24_4_;
  iVar137 = (uint)!SUB81(uVar92 >> 7,0) * auVar116._28_4_;
  auVar185 = ZEXT3264(CONCAT428(iVar137,CONCAT424(iVar136,CONCAT420(iVar135,CONCAT416(iVar134,
                                                  CONCAT412(iVar133,CONCAT48(iVar132,CONCAT44(iVar96
                                                  ,iVar131))))))));
  auVar107 = vmulps_avx512vl(auVar127,ZEXT1632(auVar97));
  bVar14 = (bool)(bVar74 >> 1 & 1);
  bVar17 = (bool)(bVar74 >> 2 & 1);
  bVar20 = (bool)(bVar74 >> 3 & 1);
  bVar28 = (bool)(bVar74 >> 4 & 1);
  bVar37 = (bool)(bVar74 >> 5 & 1);
  bVar38 = (bool)(bVar74 >> 6 & 1);
  local_480[0] = (uint)(bVar74 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar74 & 1) * iVar131;
  local_480[1] = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * iVar96;
  local_480[2] = (uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * iVar132;
  local_480[3] = (uint)bVar20 * auVar107._12_4_ | (uint)!bVar20 * iVar133;
  uStack_470 = (uint)bVar28 * auVar107._16_4_ | (uint)!bVar28 * iVar134;
  uStack_46c = (uint)bVar37 * auVar107._20_4_ | (uint)!bVar37 * iVar135;
  uStack_468 = (uint)bVar38 * auVar107._24_4_ | (uint)!bVar38 * iVar136;
  uStack_464 = (uint)(bVar74 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar74 >> 7) * iVar137;
  auVar128 = vmulps_avx512vl(auVar128,auVar127);
  local_460 = ZEXT432(0) << 0x20;
  auVar107 = vxorps_avx512vl(auVar104,auVar150);
  auVar164 = ZEXT3264(auVar107);
  local_440._0_4_ = auVar139._0_4_ + auVar126._0_4_;
  local_440._4_4_ = auVar139._4_4_ + auVar126._4_4_;
  local_440._8_4_ = auVar139._8_4_ + auVar126._8_4_;
  local_440._12_4_ = auVar139._12_4_ + auVar126._12_4_;
  local_440._16_4_ = auVar139._16_4_ + auVar126._16_4_;
  local_440._20_4_ = auVar139._20_4_ + auVar126._20_4_;
  local_440._24_4_ = auVar139._24_4_ + auVar126._24_4_;
  local_440._28_4_ = auVar126._28_4_ + 0.0;
  local_420[0] = (uint)(bVar74 & 1) * auVar110._0_4_ |
                 (uint)!(bool)(bVar74 & 1) *
                 ((uint)(bVar90 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar101._0_4_);
  local_420[1] = (uint)bVar13 * auVar110._4_4_ |
                 (uint)!bVar13 * ((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar101._4_4_);
  local_420[2] = (uint)bVar16 * auVar110._8_4_ |
                 (uint)!bVar16 * ((uint)bVar15 * auVar103._8_4_ | (uint)!bVar15 * auVar101._8_4_);
  local_420[3] = (uint)bVar19 * auVar110._12_4_ |
                 (uint)!bVar19 * ((uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar101._12_4_);
  uStack_410 = (uint)bVar22 * auVar110._16_4_ |
               (uint)!bVar22 * ((uint)bVar21 * auVar103._16_4_ | (uint)!bVar21 * auVar101._16_4_);
  uStack_40c = (uint)bVar36 * auVar110._20_4_ |
               (uint)!bVar36 * ((uint)bVar29 * auVar103._20_4_ | (uint)!bVar29 * auVar101._20_4_);
  uStack_408 = (uint)bVar46 * auVar110._24_4_ |
               (uint)!bVar46 * ((uint)bVar45 * auVar103._24_4_ | (uint)!bVar45 * auVar101._24_4_);
  uStack_404 = (uint)(bVar74 >> 7) * auVar110._28_4_ |
               (uint)!(bool)(bVar74 >> 7) *
               ((uint)bVar47 * auVar103._28_4_ | (uint)!bVar47 * auVar101._28_4_);
  auVar101 = vblendmps_avx512vl(auVar104,auVar107);
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
  bVar15 = (bool)((byte)(uVar92 >> 3) & 1);
  bVar16 = (bool)((byte)(uVar92 >> 4) & 1);
  bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
  bVar18 = (bool)((byte)(uVar92 >> 6) & 1);
  auVar102 = vsubps_avx512vl(auVar102,auVar128);
  local_400[0] = (uint)(bVar74 & 1) * auVar102._0_4_ |
                 (uint)!(bool)(bVar74 & 1) *
                 ((uint)(bVar90 & 1) * auVar101._0_4_ |
                 (uint)!(bool)(bVar90 & 1) * (int)auVar139._0_4_);
  bVar13 = (bool)(bVar74 >> 1 & 1);
  local_400[1] = (uint)bVar13 * auVar102._4_4_ |
                 (uint)!bVar13 *
                 ((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * (int)auVar139._4_4_);
  bVar12 = (bool)(bVar74 >> 2 & 1);
  local_400[2] = (uint)bVar12 * auVar102._8_4_ |
                 (uint)!bVar12 *
                 ((uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * (int)auVar139._8_4_);
  bVar12 = (bool)(bVar74 >> 3 & 1);
  local_400[3] = (uint)bVar12 * auVar102._12_4_ |
                 (uint)!bVar12 *
                 ((uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * (int)auVar139._12_4_);
  bVar12 = (bool)(bVar74 >> 4 & 1);
  uStack_3f0 = (uint)bVar12 * auVar102._16_4_ |
               (uint)!bVar12 *
               ((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * (int)auVar139._16_4_);
  bVar12 = (bool)(bVar74 >> 5 & 1);
  uStack_3ec = (uint)bVar12 * auVar102._20_4_ |
               (uint)!bVar12 *
               ((uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * (int)auVar139._20_4_);
  bVar12 = (bool)(bVar74 >> 6 & 1);
  uStack_3e8 = (uint)bVar12 * auVar102._24_4_ |
               (uint)!bVar12 *
               ((uint)bVar18 * auVar101._24_4_ | (uint)!bVar18 * (int)auVar139._24_4_);
  uStack_3e4 = (uint)(bVar74 >> 7) * auVar102._28_4_ |
               (uint)!(bool)(bVar74 >> 7) * (uint)(byte)(uVar92 >> 7) * auVar101._28_4_;
  _local_c0 = vmulps_avx512vl(auVar105,auVar81);
  auVar101 = vmulps_avx512vl(auVar105,auVar143);
  auVar155 = ZEXT3264(auVar101);
  auVar102 = vmulps_avx512vl(auVar100,auVar126);
  auVar102 = vaddps_avx512vl(auVar106,auVar102);
  auVar102 = vmulps_avx512vl(auVar112,auVar102);
  auVar100._0_4_ = local_c0._0_4_ + auVar102._0_4_;
  auVar100._4_4_ = local_c0._4_4_ + auVar102._4_4_;
  auVar100._8_4_ = local_c0._8_4_ + auVar102._8_4_;
  auVar100._12_4_ = local_c0._12_4_ + auVar102._12_4_;
  auVar100._16_4_ = local_c0._16_4_ + auVar102._16_4_;
  auVar100._20_4_ = local_c0._20_4_ + auVar102._20_4_;
  auVar100._24_4_ = local_c0._24_4_ + auVar102._24_4_;
  auVar100._28_4_ = local_c0._28_4_ + auVar102._28_4_;
  auVar98._4_4_ = auVar101._4_4_ * auVar127._4_4_;
  auVar98._0_4_ = auVar101._0_4_ * auVar127._0_4_;
  auVar98._8_4_ = auVar101._8_4_ * auVar127._8_4_;
  auVar98._12_4_ = auVar101._12_4_ * auVar127._12_4_;
  auVar98._16_4_ = auVar101._16_4_ * auVar127._16_4_;
  auVar98._20_4_ = auVar101._20_4_ * auVar127._20_4_;
  auVar98._24_4_ = auVar101._24_4_ * auVar127._24_4_;
  auVar98._28_4_ = auVar143._28_4_;
  local_a0 = vxorps_avx512vl(auVar105,auVar150);
  auVar101 = vblendmps_avx512vl(auVar105,local_a0);
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
  bVar15 = (bool)((byte)(uVar92 >> 3) & 1);
  bVar16 = (bool)((byte)(uVar92 >> 4) & 1);
  bVar17 = (bool)((byte)(uVar92 >> 5) & 1);
  bVar18 = (bool)((byte)(uVar92 >> 6) & 1);
  bVar19 = SUB81(uVar92 >> 7,0);
  auVar148 = ZEXT3264(local_440);
  auVar102 = vsubps_avx512vl(auVar100,auVar98);
  local_3e0[0] = (uint)(bVar74 & 1) * auVar102._0_4_ |
                 (uint)!(bool)(bVar74 & 1) *
                 ((uint)(bVar90 & 1) * auVar101._0_4_ | !(bool)(bVar90 & 1) * local_400[0]);
  bVar13 = (bool)(bVar74 >> 1 & 1);
  local_3e0[1] = (uint)bVar13 * auVar102._4_4_ |
                 (uint)!bVar13 * ((uint)bVar12 * auVar101._4_4_ | !bVar12 * local_400[1]);
  bVar12 = (bool)(bVar74 >> 2 & 1);
  local_3e0[2] = (uint)bVar12 * auVar102._8_4_ |
                 (uint)!bVar12 * ((uint)bVar14 * auVar101._8_4_ | !bVar14 * local_400[2]);
  bVar12 = (bool)(bVar74 >> 3 & 1);
  local_3e0[3] = (uint)bVar12 * auVar102._12_4_ |
                 (uint)!bVar12 * ((uint)bVar15 * auVar101._12_4_ | !bVar15 * local_400[3]);
  bVar12 = (bool)(bVar74 >> 4 & 1);
  uStack_3d0 = (uint)bVar12 * auVar102._16_4_ |
               (uint)!bVar12 * ((uint)bVar16 * auVar101._16_4_ | !bVar16 * uStack_3f0);
  bVar12 = (bool)(bVar74 >> 5 & 1);
  uStack_3cc = (uint)bVar12 * auVar102._20_4_ |
               (uint)!bVar12 * ((uint)bVar17 * auVar101._20_4_ | !bVar17 * uStack_3ec);
  bVar12 = (bool)(bVar74 >> 6 & 1);
  uStack_3c8 = (uint)bVar12 * auVar102._24_4_ |
               (uint)!bVar12 * ((uint)bVar18 * auVar101._24_4_ | !bVar18 * uStack_3e8);
  uStack_3c4 = (uint)(bVar74 >> 7) * auVar102._28_4_ |
               (uint)!(bool)(bVar74 >> 7) * ((uint)bVar19 * auVar101._28_4_ | !bVar19 * uStack_3e4);
  auVar101 = vblendmps_avx512vl(auVar113,local_440);
  auVar99._0_4_ = (uint)(bVar82 & 1) * auVar101._0_4_ | !(bool)(bVar82 & 1) * local_3e0[0];
  bVar12 = (bool)(bVar82 >> 1 & 1);
  auVar99._4_4_ = (uint)bVar12 * auVar101._4_4_ | !bVar12 * local_3e0[1];
  bVar12 = (bool)(bVar82 >> 2 & 1);
  auVar99._8_4_ = (uint)bVar12 * auVar101._8_4_ | !bVar12 * local_3e0[2];
  bVar12 = (bool)(bVar82 >> 3 & 1);
  auVar99._12_4_ = (uint)bVar12 * auVar101._12_4_ | !bVar12 * local_3e0[3];
  bVar12 = (bool)(bVar82 >> 4 & 1);
  auVar99._16_4_ = (uint)bVar12 * auVar101._16_4_ | !bVar12 * uStack_3d0;
  bVar12 = (bool)(bVar82 >> 5 & 1);
  auVar99._20_4_ = (uint)bVar12 * auVar101._20_4_ | !bVar12 * uStack_3cc;
  bVar12 = (bool)(bVar82 >> 6 & 1);
  auVar99._24_4_ = (uint)bVar12 * auVar101._24_4_ | !bVar12 * uStack_3c8;
  auVar99._28_4_ = (uint)(bVar82 >> 7) * auVar101._28_4_ | !(bool)(bVar82 >> 7) * uStack_3c4;
  auVar101 = vshufps_avx(auVar99,auVar99,0xb1);
  auVar101 = vminps_avx(auVar99,auVar101);
  auVar102 = vshufpd_avx(auVar101,auVar101,5);
  auVar101 = vminps_avx(auVar101,auVar102);
  auVar102 = vpermpd_avx2(auVar101,0x4e);
  auVar101 = vminps_avx(auVar101,auVar102);
  uVar69 = vcmpps_avx512vl(auVar99,auVar101,0);
  uVar85 = uVar91;
  if (((byte)uVar69 & bVar82) != 0) {
    uVar85 = (uint)((byte)uVar69 & bVar82);
  }
  uVar84 = 0;
  for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
    uVar84 = uVar84 + 1;
  }
  auVar97 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar158 = ZEXT1664(auVar97);
  auVar101 = vpcmpeqd_avx2(local_440,local_440);
  auVar178 = ZEXT3264(auVar101);
  auVar162 = ZEXT3264(auVar114);
  local_5c8 = pSVar86;
  do {
    bVar90 = (byte)uVar94;
    auVar153 = auVar155._0_28_;
    local_5c0.hit = local_530;
    local_5c0.valid = (int *)local_5e0;
    auVar154 = auVar185._0_32_;
    auVar103 = auVar176._0_32_;
    auVar109 = auVar193._0_32_;
    auVar108 = auVar192._0_32_;
    auVar102 = auVar164._0_32_;
    auVar111 = auVar194._0_32_;
    auVar105 = auVar191._0_32_;
    auVar152 = auVar151._28_36_;
    auVar149 = auVar184._0_32_;
    auVar121 = auVar183._0_32_;
    auVar101 = auVar162._0_32_;
    auVar107 = auVar182._0_32_;
    auVar113 = auVar196._0_32_;
    auVar112 = auVar195._0_32_;
    auVar104 = auVar190._0_32_;
    auVar100 = auVar189._0_32_;
    auVar98 = auVar188._0_32_;
    auVar156 = auVar186._0_32_;
    auVar128 = auVar180._0_32_;
    auVar106 = auVar181._0_32_;
    auVar110 = auVar179._0_32_;
    uVar88 = uVar84 & 0xff;
    uVar85 = *(uint *)(local_e0 + (ulong)uVar88 * 4);
    pGVar9 = (pSVar86->geometries).items[uVar85].ptr;
    local_5c0.ray = (RTCRayN *)ray;
    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
      uVar91 = (uint)(byte)(~(byte)(1 << (uVar84 & 0x1f)) & (byte)uVar91);
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        uVar95 = (ulong)(uVar88 << 2);
        uVar138 = *(undefined4 *)((long)local_480 + uVar95);
        uVar4 = *(undefined4 *)(local_460 + uVar95);
        uVar91 = *(uint *)(local_440 + uVar95);
        *(uint *)(ray + k * 4 + 0x80) = uVar91;
        *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_420 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_400 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_3e0 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar138;
        *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
        *(undefined4 *)(ray + k * 4 + 0x110) =
             *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
        *(uint *)(ray + k * 4 + 0x120) = uVar85;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        goto LAB_01c519e6;
      }
      local_120 = auVar148._0_32_;
      local_100 = auVar155._0_32_;
      uVar95 = (ulong)(uVar88 * 4);
      local_500 = *(undefined4 *)((long)local_480 + uVar95);
      local_4f0 = *(undefined4 *)(local_460 + uVar95);
      local_4d0 = vpbroadcastd_avx512vl();
      local_4e0._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
      uVar138 = *(undefined4 *)((long)local_420 + uVar95);
      uVar4 = *(undefined4 *)((long)local_400 + uVar95);
      local_520._4_4_ = uVar4;
      local_520._0_4_ = uVar4;
      local_520._8_4_ = uVar4;
      local_520._12_4_ = uVar4;
      auVar151 = ZEXT1664(local_520);
      local_510._4_4_ = *(undefined4 *)((long)local_3e0 + uVar95);
      local_530[0] = (RTCHitN)(char)uVar138;
      local_530[1] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[2] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[3] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_530[4] = (RTCHitN)(char)uVar138;
      local_530[5] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[6] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[7] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_530[8] = (RTCHitN)(char)uVar138;
      local_530[9] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[10] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[0xb] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_530[0xc] = (RTCHitN)(char)uVar138;
      local_530[0xd] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[0xe] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[0xf] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_510._0_4_ = local_510._4_4_;
      local_510._8_4_ = local_510._4_4_;
      local_510._12_4_ = local_510._4_4_;
      uStack_4fc = local_500;
      uStack_4f8 = local_500;
      uStack_4f4 = local_500;
      uStack_4ec = local_4f0;
      uStack_4e8 = local_4f0;
      uStack_4e4 = local_4f0;
      local_4e0._0_4_ = local_4e0._4_4_;
      local_4e0._8_4_ = local_4e0._4_4_;
      local_4e0._12_4_ = local_4e0._4_4_;
      uStack_4bc = context->user->instID[0];
      local_4c0 = uStack_4bc;
      uStack_4b8 = uStack_4bc;
      uStack_4b4 = uStack_4bc;
      uStack_4b0 = context->user->instPrimID[0];
      uStack_4ac = uStack_4b0;
      uStack_4a8 = uStack_4b0;
      uStack_4a4 = uStack_4b0;
      local_3b0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar95);
      local_5e0 = auVar158._0_16_;
      local_5c0.geometryUserPtr = pGVar9->userPtr;
      local_5c0.context = context->user;
      local_5c0.N = 4;
      local_4a0 = auVar168._0_32_;
      local_140 = auVar98;
      local_160 = auVar100;
      local_180 = auVar104;
      local_1a0 = auVar105;
      local_1c0 = auVar108;
      local_1e0 = auVar109;
      local_200 = auVar112;
      local_220 = auVar113;
      local_240 = auVar154;
      local_260 = auVar101;
      local_280 = auVar156;
      local_2a0 = auVar110;
      local_2c0 = auVar128;
      local_2e0 = auVar103;
      local_300 = auVar106;
      local_320 = auVar107;
      local_340 = auVar121;
      local_360 = auVar149;
      local_380 = auVar111;
      local_3a0 = auVar102;
      uVar95 = uVar94;
      local_590 = local_5e0;
      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
        auVar151 = ZEXT1664(local_520);
        auVar101 = ZEXT1632(auVar178._0_16_);
        local_5d0 = line;
        (*pGVar9->intersectionFilterN)(&local_5c0);
        auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
        auVar178 = ZEXT3264(auVar101);
        auVar164 = ZEXT3264(local_3a0);
        auVar194 = ZEXT3264(local_380);
        uVar95 = uVar94 & 0xffff;
        auVar184 = ZEXT3264(local_360);
        auVar183 = ZEXT3264(local_340);
        auVar182 = ZEXT3264(local_320);
        auVar181 = ZEXT3264(local_300);
        auVar176 = ZEXT3264(local_2e0);
        auVar180 = ZEXT3264(local_2c0);
        auVar179 = ZEXT3264(local_2a0);
        auVar186 = ZEXT3264(local_280);
        auVar162 = ZEXT3264(local_260);
        auVar158 = ZEXT1664(local_590);
        auVar185 = ZEXT3264(local_240);
        auVar196 = ZEXT3264(local_220);
        auVar195 = ZEXT3264(local_200);
        auVar193 = ZEXT3264(local_1e0);
        auVar192 = ZEXT3264(local_1c0);
        auVar191 = ZEXT3264(local_1a0);
        auVar190 = ZEXT3264(local_180);
        auVar189 = ZEXT3264(local_160);
        auVar188 = ZEXT3264(local_140);
        auVar168 = ZEXT3264(local_4a0);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar187 = ZEXT3264(auVar101);
        pSVar86 = local_5c8;
        line = local_5d0;
      }
      uVar93 = vptestmd_avx512vl(local_5e0,local_5e0);
      auVar155 = ZEXT3264(local_100);
      auVar148 = ZEXT3264(local_120);
      if ((uVar93 & 0xf) == 0) {
LAB_01c51903:
        *(undefined4 *)(ray + k * 4 + 0x80) = local_3b0._0_4_;
        uVar138 = local_3b0._0_4_;
      }
      else {
        p_Var11 = context->args->filter;
        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
          auVar151 = ZEXT1664(auVar151._0_16_);
          auVar101 = ZEXT1632(auVar178._0_16_);
          (*p_Var11)(&local_5c0);
          auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
          auVar178 = ZEXT3264(auVar101);
          auVar148 = ZEXT3264(local_120);
          auVar155 = ZEXT3264(local_100);
          auVar164 = ZEXT3264(local_3a0);
          auVar194 = ZEXT3264(local_380);
          uVar95 = uVar94 & 0xffff;
          auVar184 = ZEXT3264(local_360);
          auVar183 = ZEXT3264(local_340);
          auVar182 = ZEXT3264(local_320);
          auVar181 = ZEXT3264(local_300);
          auVar176 = ZEXT3264(local_2e0);
          auVar180 = ZEXT3264(local_2c0);
          auVar179 = ZEXT3264(local_2a0);
          auVar186 = ZEXT3264(local_280);
          auVar162 = ZEXT3264(local_260);
          auVar158 = ZEXT1664(local_590);
          auVar185 = ZEXT3264(local_240);
          auVar196 = ZEXT3264(local_220);
          auVar195 = ZEXT3264(local_200);
          auVar193 = ZEXT3264(local_1e0);
          auVar192 = ZEXT3264(local_1c0);
          auVar191 = ZEXT3264(local_1a0);
          auVar190 = ZEXT3264(local_180);
          auVar189 = ZEXT3264(local_160);
          auVar188 = ZEXT3264(local_140);
          auVar168 = ZEXT3264(local_4a0);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar187 = ZEXT3264(auVar101);
          pSVar86 = local_5c8;
        }
        uVar93 = vptestmd_avx512vl(local_5e0,local_5e0);
        uVar93 = uVar93 & 0xf;
        bVar90 = (byte)uVar93;
        if (bVar90 == 0) goto LAB_01c51903;
        iVar96 = *(int *)(local_5c0.hit + 4);
        iVar131 = *(int *)(local_5c0.hit + 8);
        iVar132 = *(int *)(local_5c0.hit + 0xc);
        bVar12 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar14 = SUB81(uVar93 >> 3,0);
        *(uint *)(local_5c0.ray + 0xc0) =
             (uint)(bVar90 & 1) * *(int *)local_5c0.hit |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xc0);
        *(uint *)(local_5c0.ray + 0xc4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xc4);
        *(uint *)(local_5c0.ray + 200) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 200);
        *(uint *)(local_5c0.ray + 0xcc) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xcc);
        iVar96 = *(int *)(local_5c0.hit + 0x14);
        iVar131 = *(int *)(local_5c0.hit + 0x18);
        iVar132 = *(int *)(local_5c0.hit + 0x1c);
        bVar12 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar14 = SUB81(uVar93 >> 3,0);
        *(uint *)(local_5c0.ray + 0xd0) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x10) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xd0);
        *(uint *)(local_5c0.ray + 0xd4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xd4);
        *(uint *)(local_5c0.ray + 0xd8) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0xd8);
        *(uint *)(local_5c0.ray + 0xdc) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xdc);
        iVar96 = *(int *)(local_5c0.hit + 0x24);
        iVar131 = *(int *)(local_5c0.hit + 0x28);
        iVar132 = *(int *)(local_5c0.hit + 0x2c);
        bVar12 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar14 = SUB81(uVar93 >> 3,0);
        *(uint *)(local_5c0.ray + 0xe0) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x20) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xe0);
        *(uint *)(local_5c0.ray + 0xe4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xe4);
        *(uint *)(local_5c0.ray + 0xe8) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0xe8);
        *(uint *)(local_5c0.ray + 0xec) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xec);
        iVar96 = *(int *)(local_5c0.hit + 0x34);
        iVar131 = *(int *)(local_5c0.hit + 0x38);
        iVar132 = *(int *)(local_5c0.hit + 0x3c);
        bVar12 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar14 = SUB81(uVar93 >> 3,0);
        *(uint *)(local_5c0.ray + 0xf0) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x30) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0xf0);
        *(uint *)(local_5c0.ray + 0xf4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xf4);
        *(uint *)(local_5c0.ray + 0xf8) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0xf8);
        *(uint *)(local_5c0.ray + 0xfc) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xfc);
        iVar96 = *(int *)(local_5c0.hit + 0x44);
        iVar131 = *(int *)(local_5c0.hit + 0x48);
        iVar132 = *(int *)(local_5c0.hit + 0x4c);
        bVar12 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar14 = SUB81(uVar93 >> 3,0);
        *(uint *)(local_5c0.ray + 0x100) =
             (uint)(bVar90 & 1) * *(int *)(local_5c0.hit + 0x40) |
             (uint)!(bool)(bVar90 & 1) * *(int *)(local_5c0.ray + 0x100);
        *(uint *)(local_5c0.ray + 0x104) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0x104);
        *(uint *)(local_5c0.ray + 0x108) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0x108);
        *(uint *)(local_5c0.ray + 0x10c) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0x10c);
        auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x50));
        *(undefined1 (*) [16])(local_5c0.ray + 0x110) = auVar97;
        auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x60));
        *(undefined1 (*) [16])(local_5c0.ray + 0x120) = auVar97;
        auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x70));
        *(undefined1 (*) [16])(local_5c0.ray + 0x130) = auVar97;
        auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x80));
        *(undefined1 (*) [16])(local_5c0.ray + 0x140) = auVar97;
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
      }
      auVar99._4_4_ = uVar138;
      auVar99._0_4_ = uVar138;
      auVar99._8_4_ = uVar138;
      auVar99._12_4_ = uVar138;
      auVar99._16_4_ = uVar138;
      auVar99._20_4_ = uVar138;
      auVar99._24_4_ = uVar138;
      auVar99._28_4_ = uVar138;
      uVar69 = vcmpps_avx512vl(auVar148._0_32_,auVar99,2);
      uVar91 = (uint)(byte)(~(byte)(1 << (uVar84 & 0x1f)) & (byte)uVar91) & (uint)uVar69;
      uVar94 = uVar95;
    }
    bVar90 = (byte)uVar94;
    auVar153 = auVar155._0_28_;
    auVar154 = auVar185._0_32_;
    auVar103 = auVar176._0_32_;
    auVar109 = auVar193._0_32_;
    auVar108 = auVar192._0_32_;
    auVar102 = auVar164._0_32_;
    auVar111 = auVar194._0_32_;
    auVar105 = auVar191._0_32_;
    auVar152 = auVar151._28_36_;
    auVar149 = auVar184._0_32_;
    auVar121 = auVar183._0_32_;
    auVar101 = auVar162._0_32_;
    auVar107 = auVar182._0_32_;
    auVar113 = auVar196._0_32_;
    auVar112 = auVar195._0_32_;
    auVar104 = auVar190._0_32_;
    auVar100 = auVar189._0_32_;
    auVar98 = auVar188._0_32_;
    auVar156 = auVar186._0_32_;
    auVar128 = auVar180._0_32_;
    auVar106 = auVar181._0_32_;
    auVar110 = auVar179._0_32_;
    bVar82 = (byte)uVar91;
    if (bVar82 == 0) break;
    auVar101 = vblendmps_avx512vl(auVar187._0_32_,auVar148._0_32_);
    auVar129._0_4_ = (uint)(bVar82 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar99._0_4_
    ;
    bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar99._4_4_;
    bVar12 = (bool)((byte)(uVar91 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar99._8_4_;
    bVar12 = (bool)((byte)(uVar91 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar99._12_4_;
    bVar12 = (bool)((byte)(uVar91 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar99._16_4_;
    bVar12 = (bool)((byte)(uVar91 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar99._20_4_;
    bVar12 = (bool)((byte)(uVar91 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar99._24_4_;
    auVar129._28_4_ = (uVar91 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar91 >> 7,0) * auVar99._28_4_
    ;
    auVar101 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar101 = vminps_avx(auVar129,auVar101);
    auVar102 = vshufpd_avx(auVar101,auVar101,5);
    auVar101 = vminps_avx(auVar101,auVar102);
    auVar102 = vpermpd_avx2(auVar101,0x4e);
    auVar101 = vminps_avx(auVar101,auVar102);
    uVar69 = vcmpps_avx512vl(auVar129,auVar101,0);
    bVar82 = (byte)uVar69 & bVar82;
    uVar85 = uVar91;
    if (bVar82 != 0) {
      uVar85 = (uint)bVar82;
    }
    uVar84 = 0;
    for (; auVar99 = auVar129, (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
      uVar84 = uVar84 + 1;
    }
  } while( true );
  uVar91 = *(uint *)(ray + k * 4 + 0x80);
LAB_01c519e6:
  auVar188 = ZEXT464(uVar91);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(uVar91));
  local_440 = auVar168._0_32_;
  uVar69 = vcmpps_avx512vl(local_440,auVar99,2);
  bVar83 = bVar90 & (byte)uVar69 & bVar89 & bVar83;
  uVar91 = (uint)bVar83;
  if (bVar83 == 0) {
    return;
  }
  uVar69 = vcmpps_avx512vl(auVar106,auVar110,0);
  uVar70 = vcmpps_avx512vl(auVar106,auVar128,0);
  bVar82 = (byte)uVar69 | (byte)uVar70;
  uVar95 = vcmpps_avx512vl(auVar106,auVar156,0);
  auVar110 = vmulps_avx512vl(auVar98,auVar106);
  auVar128 = vmulps_avx512vl(auVar100,auVar106);
  auVar106 = vmulps_avx512vl(auVar104,auVar106);
  auVar140._0_4_ = auVar110._0_4_ + (float)local_580._0_4_;
  auVar140._4_4_ = auVar110._4_4_ + (float)local_580._4_4_;
  auVar140._8_4_ = auVar110._8_4_ + fStack_578;
  auVar140._12_4_ = auVar110._12_4_ + fStack_574;
  auVar140._16_4_ = auVar110._16_4_ + fStack_570;
  auVar140._20_4_ = auVar110._20_4_ + fStack_56c;
  auVar140._24_4_ = auVar110._24_4_ + fStack_568;
  auVar140._28_4_ = auVar110._28_4_ + fStack_564;
  auVar142._0_4_ = auVar128._0_4_ + (float)local_560._0_4_;
  auVar142._4_4_ = auVar128._4_4_ + (float)local_560._4_4_;
  auVar142._8_4_ = auVar128._8_4_ + fStack_558;
  auVar142._12_4_ = auVar128._12_4_ + fStack_554;
  auVar142._16_4_ = auVar128._16_4_ + fStack_550;
  auVar142._20_4_ = auVar128._20_4_ + fStack_54c;
  auVar142._24_4_ = auVar128._24_4_ + fStack_548;
  auVar142._28_4_ = auVar128._28_4_ + fStack_544;
  auVar110 = vaddps_avx512vl(auVar112,auVar106);
  auVar128 = vmulps_avx512vl(auVar113,auVar140);
  auVar106 = vmulps_avx512vl(auVar113,auVar142);
  auVar110 = vmulps_avx512vl(auVar113,auVar110);
  auVar141._0_4_ = auVar128._0_4_ + (float)local_80._0_4_;
  auVar141._4_4_ = auVar128._4_4_ + (float)local_80._4_4_;
  auVar141._8_4_ = auVar128._8_4_ + fStack_78;
  auVar141._12_4_ = auVar128._12_4_ + fStack_74;
  auVar141._16_4_ = auVar128._16_4_ + fStack_70;
  auVar141._20_4_ = auVar128._20_4_ + fStack_6c;
  auVar141._24_4_ = auVar128._24_4_ + fStack_68;
  auVar141._28_4_ = auVar128._28_4_ + fStack_64;
  auVar128 = vaddps_avx512vl(auVar107,auVar106);
  auVar144._0_4_ = auVar110._0_4_ + (float)local_c0._0_4_;
  auVar144._4_4_ = auVar110._4_4_ + (float)local_c0._4_4_;
  auVar144._8_4_ = auVar110._8_4_ + fStack_b8;
  auVar144._12_4_ = auVar110._12_4_ + fStack_b4;
  auVar144._16_4_ = auVar110._16_4_ + fStack_b0;
  auVar144._20_4_ = auVar110._20_4_ + fStack_ac;
  auVar144._24_4_ = auVar110._24_4_ + fStack_a8;
  auVar144._28_4_ = auVar110._28_4_ + fStack_a4;
  auVar110 = vmulps_avx512vl(auVar121,auVar101);
  auVar106 = vmulps_avx512vl(auVar149,auVar101);
  auVar189._0_4_ = auVar101._0_4_ * auVar153._0_4_;
  auVar189._4_4_ = auVar101._4_4_ * auVar153._4_4_;
  auVar189._8_4_ = auVar101._8_4_ * auVar153._8_4_;
  auVar189._12_4_ = auVar101._12_4_ * auVar153._12_4_;
  auVar189._16_4_ = auVar101._16_4_ * auVar153._16_4_;
  auVar189._20_4_ = auVar101._20_4_ * auVar153._20_4_;
  auVar189._24_4_ = auVar101._24_4_ * auVar153._24_4_;
  auVar189._28_36_ = auVar152;
  bVar90 = (byte)uVar95;
  bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
  bVar18 = (bool)((byte)(uVar95 >> 2) & 1);
  bVar29 = (bool)((byte)(uVar95 >> 3) & 1);
  bVar47 = (bool)((byte)(uVar95 >> 4) & 1);
  bVar30 = (bool)((byte)(uVar95 >> 5) & 1);
  bVar39 = (bool)((byte)(uVar95 >> 6) & 1);
  bVar48 = SUB81(uVar95 >> 7,0);
  bVar13 = (bool)((byte)(uVar95 >> 1) & 1);
  bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
  bVar36 = (bool)((byte)(uVar95 >> 3) & 1);
  bVar23 = (bool)((byte)(uVar95 >> 4) & 1);
  bVar31 = (bool)((byte)(uVar95 >> 5) & 1);
  bVar40 = (bool)((byte)(uVar95 >> 6) & 1);
  bVar49 = SUB81(uVar95 >> 7,0);
  bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
  bVar20 = (bool)((byte)(uVar95 >> 2) & 1);
  bVar37 = (bool)((byte)(uVar95 >> 3) & 1);
  bVar24 = (bool)((byte)(uVar95 >> 4) & 1);
  bVar32 = (bool)((byte)(uVar95 >> 5) & 1);
  bVar41 = (bool)((byte)(uVar95 >> 6) & 1);
  bVar50 = SUB81(uVar95 >> 7,0);
  auVar110 = vsubps_avx512vl(auVar141,auVar110);
  bVar15 = (bool)(bVar82 >> 1 & 1);
  bVar21 = (bool)(bVar82 >> 2 & 1);
  bVar45 = (bool)(bVar82 >> 3 & 1);
  bVar25 = (bool)(bVar82 >> 4 & 1);
  bVar33 = (bool)(bVar82 >> 5 & 1);
  bVar42 = (bool)(bVar82 >> 6 & 1);
  auVar128 = vsubps_avx512vl(auVar128,auVar106);
  bVar16 = (bool)(bVar82 >> 1 & 1);
  bVar22 = (bool)(bVar82 >> 2 & 1);
  bVar46 = (bool)(bVar82 >> 3 & 1);
  bVar26 = (bool)(bVar82 >> 4 & 1);
  bVar34 = (bool)(bVar82 >> 5 & 1);
  bVar43 = (bool)(bVar82 >> 6 & 1);
  auVar103 = vmulps_avx512vl(auVar101,auVar103);
  bVar17 = (bool)(bVar82 >> 1 & 1);
  bVar28 = (bool)(bVar82 >> 2 & 1);
  bVar38 = (bool)(bVar82 >> 3 & 1);
  bVar27 = (bool)(bVar82 >> 4 & 1);
  bVar35 = (bool)(bVar82 >> 5 & 1);
  bVar44 = (bool)(bVar82 >> 6 & 1);
  local_480[0] = (uint)(bVar82 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar154._0_4_;
  local_480[1] = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar154._4_4_;
  local_480[2] = (uint)bVar28 * auVar103._8_4_ | (uint)!bVar28 * auVar154._8_4_;
  local_480[3] = (uint)bVar38 * auVar103._12_4_ | (uint)!bVar38 * auVar154._12_4_;
  uStack_470 = (uint)bVar27 * auVar103._16_4_ | (uint)!bVar27 * auVar154._16_4_;
  uStack_46c = (uint)bVar35 * auVar103._20_4_ | (uint)!bVar35 * auVar154._20_4_;
  uStack_468 = (uint)bVar44 * auVar103._24_4_ | (uint)!bVar44 * auVar154._24_4_;
  uStack_464 = (uint)(bVar82 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar154._28_4_;
  auVar103 = vsubps_avx512vl(auVar144,auVar189._0_32_);
  bVar17 = (bool)(bVar82 >> 1 & 1);
  bVar28 = (bool)(bVar82 >> 2 & 1);
  bVar38 = (bool)(bVar82 >> 3 & 1);
  bVar27 = (bool)(bVar82 >> 4 & 1);
  bVar35 = (bool)(bVar82 >> 5 & 1);
  bVar44 = (bool)(bVar82 >> 6 & 1);
  local_460 = ZEXT432(0) << 0x20;
  local_420[0] = (uint)(bVar82 & 1) * auVar110._0_4_ |
                 (uint)!(bool)(bVar82 & 1) *
                 ((uint)(bVar90 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar105._0_4_);
  local_420[1] = (uint)bVar15 * auVar110._4_4_ |
                 (uint)!bVar15 * ((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar105._4_4_);
  local_420[2] = (uint)bVar21 * auVar110._8_4_ |
                 (uint)!bVar21 * ((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar105._8_4_);
  local_420[3] = (uint)bVar45 * auVar110._12_4_ |
                 (uint)!bVar45 * ((uint)bVar29 * auVar111._12_4_ | (uint)!bVar29 * auVar105._12_4_);
  uStack_410 = (uint)bVar25 * auVar110._16_4_ |
               (uint)!bVar25 * ((uint)bVar47 * auVar111._16_4_ | (uint)!bVar47 * auVar105._16_4_);
  uStack_40c = (uint)bVar33 * auVar110._20_4_ |
               (uint)!bVar33 * ((uint)bVar30 * auVar111._20_4_ | (uint)!bVar30 * auVar105._20_4_);
  uStack_408 = (uint)bVar42 * auVar110._24_4_ |
               (uint)!bVar42 * ((uint)bVar39 * auVar111._24_4_ | (uint)!bVar39 * auVar105._24_4_);
  uStack_404 = (uint)(bVar82 >> 7) * auVar110._28_4_ |
               (uint)!(bool)(bVar82 >> 7) *
               ((uint)bVar48 * auVar111._28_4_ | (uint)!bVar48 * auVar105._28_4_);
  local_400[0] = (uint)(bVar82 & 1) * auVar128._0_4_ |
                 (uint)!(bool)(bVar82 & 1) *
                 ((uint)(bVar90 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar108._0_4_);
  local_400[1] = (uint)bVar16 * auVar128._4_4_ |
                 (uint)!bVar16 * ((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar108._4_4_);
  local_400[2] = (uint)bVar22 * auVar128._8_4_ |
                 (uint)!bVar22 * ((uint)bVar19 * auVar102._8_4_ | (uint)!bVar19 * auVar108._8_4_);
  local_400[3] = (uint)bVar46 * auVar128._12_4_ |
                 (uint)!bVar46 * ((uint)bVar36 * auVar102._12_4_ | (uint)!bVar36 * auVar108._12_4_);
  uStack_3f0 = (uint)bVar26 * auVar128._16_4_ |
               (uint)!bVar26 * ((uint)bVar23 * auVar102._16_4_ | (uint)!bVar23 * auVar108._16_4_);
  uStack_3ec = (uint)bVar34 * auVar128._20_4_ |
               (uint)!bVar34 * ((uint)bVar31 * auVar102._20_4_ | (uint)!bVar31 * auVar108._20_4_);
  uStack_3e8 = (uint)bVar43 * auVar128._24_4_ |
               (uint)!bVar43 * ((uint)bVar40 * auVar102._24_4_ | (uint)!bVar40 * auVar108._24_4_);
  uStack_3e4 = (uint)(bVar82 >> 7) * auVar128._28_4_ |
               (uint)!(bool)(bVar82 >> 7) *
               ((uint)bVar49 * auVar102._28_4_ | (uint)!bVar49 * auVar108._28_4_);
  local_3e0[0] = (uint)(bVar82 & 1) * auVar103._0_4_ |
                 (uint)!(bool)(bVar82 & 1) *
                 ((uint)(bVar90 & 1) * local_a0._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar109._0_4_);
  local_3e0[1] = (uint)bVar17 * auVar103._4_4_ |
                 (uint)!bVar17 * ((uint)bVar14 * local_a0._4_4_ | (uint)!bVar14 * auVar109._4_4_);
  local_3e0[2] = (uint)bVar28 * auVar103._8_4_ |
                 (uint)!bVar28 * ((uint)bVar20 * local_a0._8_4_ | (uint)!bVar20 * auVar109._8_4_);
  local_3e0[3] = (uint)bVar38 * auVar103._12_4_ |
                 (uint)!bVar38 * ((uint)bVar37 * local_a0._12_4_ | (uint)!bVar37 * auVar109._12_4_);
  uStack_3d0 = (uint)bVar27 * auVar103._16_4_ |
               (uint)!bVar27 * ((uint)bVar24 * local_a0._16_4_ | (uint)!bVar24 * auVar109._16_4_);
  uStack_3cc = (uint)bVar35 * auVar103._20_4_ |
               (uint)!bVar35 * ((uint)bVar32 * local_a0._20_4_ | (uint)!bVar32 * auVar109._20_4_);
  uStack_3c8 = (uint)bVar44 * auVar103._24_4_ |
               (uint)!bVar44 * ((uint)bVar41 * local_a0._24_4_ | (uint)!bVar41 * auVar109._24_4_);
  uStack_3c4 = (uint)(bVar82 >> 7) * auVar103._28_4_ |
               (uint)!(bool)(bVar82 >> 7) *
               ((uint)bVar50 * local_a0._28_4_ | (uint)!bVar50 * auVar109._28_4_);
  auVar87 = (undefined1  [8])context->scene;
  auVar102 = vblendmps_avx512vl(auVar187._0_32_,local_440);
  auVar130._4_4_ = (uint)(bVar83 >> 1 & 1) * auVar102._4_4_;
  auVar130._0_4_ = (uint)(bVar83 & 1) * auVar102._0_4_;
  auVar130._8_4_ = (uint)(bVar83 >> 2 & 1) * auVar102._8_4_;
  auVar130._12_4_ = (uint)(bVar83 >> 3 & 1) * auVar102._12_4_;
  auVar130._16_4_ = (uint)(bVar83 >> 4 & 1) * auVar102._16_4_;
  auVar130._20_4_ = (uint)(bVar83 >> 5 & 1) * auVar102._20_4_;
  auVar130._24_4_ = (uint)(bVar83 >> 6 & 1) * auVar102._24_4_;
  auVar130._28_4_ = (uint)(bVar83 >> 7) * auVar102._28_4_;
  auVar102 = vshufps_avx(auVar130,auVar130,0xb1);
  auVar102 = vminps_avx(auVar130,auVar102);
  auVar103 = vshufpd_avx(auVar102,auVar102,5);
  auVar102 = vminps_avx(auVar102,auVar103);
  auVar103 = vpermpd_avx2(auVar102,0x4e);
  auVar102 = vminps_avx(auVar102,auVar103);
  uVar69 = vcmpps_avx512vl(auVar130,auVar102,0);
  uVar85 = uVar91;
  if (((byte)uVar69 & bVar83) != 0) {
    uVar85 = (uint)((byte)uVar69 & bVar83);
  }
  uVar84 = 0;
  for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
    uVar84 = uVar84 + 1;
  }
  auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
  auVar189 = ZEXT3264(auVar101);
  do {
    local_5c0.hit = local_530;
    local_5c0.valid = (int *)local_5e0;
    uVar88 = uVar84 & 0xff;
    uVar85 = *(uint *)(local_e0 + (ulong)uVar88 * 4);
    pGVar9 = (((Scene *)auVar87)->geometries).items[uVar85].ptr;
    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
      uVar91 = (uint)(byte)(~(byte)(1 << (uVar84 & 0x1f)) & (byte)uVar91);
      auVar101 = auVar130;
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        uVar95 = (ulong)(uVar88 << 2);
        uVar138 = *(undefined4 *)((long)local_480 + uVar95);
        uVar4 = *(undefined4 *)(local_460 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_420 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_400 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_3e0 + uVar95);
        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar138;
        *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
        *(undefined4 *)(ray + k * 4 + 0x110) =
             *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
        *(uint *)(ray + k * 4 + 0x120) = uVar85;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        return;
      }
      uVar95 = (ulong)(uVar88 * 4);
      local_500 = *(undefined4 *)((long)local_480 + uVar95);
      local_4f0 = *(undefined4 *)(local_460 + uVar95);
      local_4d0 = vpbroadcastd_avx512vl();
      uVar138 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar95);
      local_4e0._4_4_ = uVar138;
      local_4e0._0_4_ = uVar138;
      local_4e0._8_4_ = uVar138;
      local_4e0._12_4_ = uVar138;
      uVar138 = *(undefined4 *)((long)local_420 + uVar95);
      uVar4 = *(undefined4 *)((long)local_400 + uVar95);
      local_520._4_4_ = uVar4;
      local_520._0_4_ = uVar4;
      local_520._8_4_ = uVar4;
      local_520._12_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)local_3e0 + uVar95);
      local_510._4_4_ = uVar4;
      local_510._0_4_ = uVar4;
      local_510._8_4_ = uVar4;
      local_510._12_4_ = uVar4;
      local_530[0] = (RTCHitN)(char)uVar138;
      local_530[1] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[2] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[3] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_530[4] = (RTCHitN)(char)uVar138;
      local_530[5] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[6] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[7] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_530[8] = (RTCHitN)(char)uVar138;
      local_530[9] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[10] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[0xb] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      local_530[0xc] = (RTCHitN)(char)uVar138;
      local_530[0xd] = (RTCHitN)(char)((uint)uVar138 >> 8);
      local_530[0xe] = (RTCHitN)(char)((uint)uVar138 >> 0x10);
      local_530[0xf] = (RTCHitN)(char)((uint)uVar138 >> 0x18);
      uStack_4fc = local_500;
      uStack_4f8 = local_500;
      uStack_4f4 = local_500;
      uStack_4ec = local_4f0;
      uStack_4e8 = local_4f0;
      uStack_4e4 = local_4f0;
      uStack_4bc = context->user->instID[0];
      local_4c0 = uStack_4bc;
      uStack_4b8 = uStack_4bc;
      uStack_4b4 = uStack_4bc;
      uStack_4b0 = context->user->instPrimID[0];
      uStack_4ac = uStack_4b0;
      uStack_4a8 = uStack_4b0;
      uStack_4a4 = uStack_4b0;
      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar95);
      local_5e0 = auVar158._0_16_;
      local_5c0.geometryUserPtr = pGVar9->userPtr;
      local_5c0.context = context->user;
      local_5c0.N = 4;
      local_4a0 = auVar168._0_32_;
      _local_580 = auVar188._0_16_;
      local_560 = auVar87;
      local_5c0.ray = (RTCRayN *)ray;
      local_590 = local_5e0;
      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
        auVar101 = ZEXT1632(auVar189._0_16_);
        local_5d0 = line;
        (*pGVar9->intersectionFilterN)(&local_5c0);
        auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
        auVar189 = ZEXT3264(auVar101);
        auVar188 = ZEXT1664(_local_580);
        auVar158 = ZEXT1664(local_590);
        auVar168 = ZEXT3264(local_4a0);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar187 = ZEXT3264(auVar101);
        auVar87 = local_560;
        line = local_5d0;
      }
      uVar95 = vptestmd_avx512vl(local_5e0,local_5e0);
      if ((uVar95 & 0xf) == 0) {
LAB_01c51e7e:
        *(int *)(ray + k * 4 + 0x80) = auVar188._0_4_;
      }
      else {
        p_Var11 = context->args->filter;
        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
          auVar101 = ZEXT1632(auVar189._0_16_);
          (*p_Var11)(&local_5c0);
          auVar101 = vpcmpeqd_avx2(auVar101,auVar101);
          auVar189 = ZEXT3264(auVar101);
          auVar188 = ZEXT1664(_local_580);
          auVar158 = ZEXT1664(local_590);
          auVar168 = ZEXT3264(local_4a0);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar187 = ZEXT3264(auVar101);
          auVar87 = local_560;
        }
        uVar95 = vptestmd_avx512vl(local_5e0,local_5e0);
        uVar95 = uVar95 & 0xf;
        bVar83 = (byte)uVar95;
        if (bVar83 == 0) goto LAB_01c51e7e;
        iVar96 = *(int *)(local_5c0.hit + 4);
        iVar131 = *(int *)(local_5c0.hit + 8);
        iVar132 = *(int *)(local_5c0.hit + 0xc);
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar14 = SUB81(uVar95 >> 3,0);
        *(uint *)(local_5c0.ray + 0xc0) =
             (uint)(bVar83 & 1) * *(int *)local_5c0.hit |
             (uint)!(bool)(bVar83 & 1) * *(int *)(local_5c0.ray + 0xc0);
        *(uint *)(local_5c0.ray + 0xc4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xc4);
        *(uint *)(local_5c0.ray + 200) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 200);
        *(uint *)(local_5c0.ray + 0xcc) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xcc);
        iVar96 = *(int *)(local_5c0.hit + 0x14);
        iVar131 = *(int *)(local_5c0.hit + 0x18);
        iVar132 = *(int *)(local_5c0.hit + 0x1c);
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar14 = SUB81(uVar95 >> 3,0);
        *(uint *)(local_5c0.ray + 0xd0) =
             (uint)(bVar83 & 1) * *(int *)(local_5c0.hit + 0x10) |
             (uint)!(bool)(bVar83 & 1) * *(int *)(local_5c0.ray + 0xd0);
        *(uint *)(local_5c0.ray + 0xd4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xd4);
        *(uint *)(local_5c0.ray + 0xd8) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0xd8);
        *(uint *)(local_5c0.ray + 0xdc) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xdc);
        iVar96 = *(int *)(local_5c0.hit + 0x24);
        iVar131 = *(int *)(local_5c0.hit + 0x28);
        iVar132 = *(int *)(local_5c0.hit + 0x2c);
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar14 = SUB81(uVar95 >> 3,0);
        *(uint *)(local_5c0.ray + 0xe0) =
             (uint)(bVar83 & 1) * *(int *)(local_5c0.hit + 0x20) |
             (uint)!(bool)(bVar83 & 1) * *(int *)(local_5c0.ray + 0xe0);
        *(uint *)(local_5c0.ray + 0xe4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xe4);
        *(uint *)(local_5c0.ray + 0xe8) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0xe8);
        *(uint *)(local_5c0.ray + 0xec) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xec);
        iVar96 = *(int *)(local_5c0.hit + 0x34);
        iVar131 = *(int *)(local_5c0.hit + 0x38);
        iVar132 = *(int *)(local_5c0.hit + 0x3c);
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar14 = SUB81(uVar95 >> 3,0);
        *(uint *)(local_5c0.ray + 0xf0) =
             (uint)(bVar83 & 1) * *(int *)(local_5c0.hit + 0x30) |
             (uint)!(bool)(bVar83 & 1) * *(int *)(local_5c0.ray + 0xf0);
        *(uint *)(local_5c0.ray + 0xf4) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0xf4);
        *(uint *)(local_5c0.ray + 0xf8) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0xf8);
        *(uint *)(local_5c0.ray + 0xfc) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0xfc);
        iVar96 = *(int *)(local_5c0.hit + 0x44);
        iVar131 = *(int *)(local_5c0.hit + 0x48);
        iVar132 = *(int *)(local_5c0.hit + 0x4c);
        bVar12 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar14 = SUB81(uVar95 >> 3,0);
        *(uint *)(local_5c0.ray + 0x100) =
             (uint)(bVar83 & 1) * *(int *)(local_5c0.hit + 0x40) |
             (uint)!(bool)(bVar83 & 1) * *(int *)(local_5c0.ray + 0x100);
        *(uint *)(local_5c0.ray + 0x104) =
             (uint)bVar12 * iVar96 | (uint)!bVar12 * *(int *)(local_5c0.ray + 0x104);
        *(uint *)(local_5c0.ray + 0x108) =
             (uint)bVar13 * iVar131 | (uint)!bVar13 * *(int *)(local_5c0.ray + 0x108);
        *(uint *)(local_5c0.ray + 0x10c) =
             (uint)bVar14 * iVar132 | (uint)!bVar14 * *(int *)(local_5c0.ray + 0x10c);
        auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x50));
        *(undefined1 (*) [16])(local_5c0.ray + 0x110) = auVar97;
        auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x60));
        *(undefined1 (*) [16])(local_5c0.ray + 0x120) = auVar97;
        auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x70));
        *(undefined1 (*) [16])(local_5c0.ray + 0x130) = auVar97;
        auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5c0.hit + 0x80));
        *(undefined1 (*) [16])(local_5c0.ray + 0x140) = auVar97;
        auVar188 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      }
      auVar101 = vbroadcastss_avx512vl(auVar188._0_16_);
      uVar69 = vcmpps_avx512vl(auVar168._0_32_,auVar101,2);
      uVar91 = (uint)(byte)(~(byte)(1 << (uVar84 & 0x1f)) & (byte)uVar91) & (uint)uVar69;
    }
    bVar83 = (byte)uVar91;
    if (bVar83 == 0) {
      return;
    }
    auVar102 = vblendmps_avx512vl(auVar187._0_32_,auVar168._0_32_);
    auVar130._0_4_ =
         (uint)(bVar83 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar101._0_4_;
    bVar12 = (bool)((byte)(uVar91 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar101._4_4_;
    bVar12 = (bool)((byte)(uVar91 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar101._8_4_;
    bVar12 = (bool)((byte)(uVar91 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar101._12_4_;
    bVar12 = (bool)((byte)(uVar91 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar101._16_4_;
    bVar12 = (bool)((byte)(uVar91 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar101._20_4_;
    bVar12 = (bool)((byte)(uVar91 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar101._24_4_;
    auVar130._28_4_ =
         (uVar91 >> 7) * auVar102._28_4_ | (uint)!SUB41(uVar91 >> 7,0) * auVar101._28_4_;
    auVar101 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar101 = vminps_avx(auVar130,auVar101);
    auVar102 = vshufpd_avx(auVar101,auVar101,5);
    auVar101 = vminps_avx(auVar101,auVar102);
    auVar102 = vpermpd_avx2(auVar101,0x4e);
    auVar101 = vminps_avx(auVar101,auVar102);
    uVar69 = vcmpps_avx512vl(auVar130,auVar101,0);
    bVar83 = (byte)uVar69 & bVar83;
    uVar85 = uVar91;
    if (bVar83 != 0) {
      uVar85 = (uint)bVar83;
    }
    uVar84 = 0;
    for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
      uVar84 = uVar84 + 1;
    }
  } while( true );
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }